

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[3]>,_QString_&>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[3]>,_QString_&>
          *this)

{
  long lVar1;
  QChar *pQVar2;
  QString *pQVar3;
  long lVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  iterator d;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (((this->a).a.b)->d).size + 7 + (this->b->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1,Uninitialized);
  pQVar2 = (QChar *)(__return_storage_ptr__->d).ptr;
  QVar6.m_data = *(this->a).a.a;
  QVar6.m_size = 5;
  local_38 = pQVar2;
  QAbstractConcatenable::convertFromUtf8(QVar6,&local_38);
  pQVar3 = (this->a).a.b;
  lVar4 = (pQVar3->d).size;
  if (lVar4 != 0) {
    pcVar5 = (pQVar3->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(local_38,pcVar5,lVar4 * 2);
  }
  local_38 = local_38 + lVar4;
  QVar7.m_data = *(this->a).b;
  QVar7.m_size = 2;
  QAbstractConcatenable::convertFromUtf8(QVar7,&local_38);
  lVar4 = (this->b->d).size;
  if (lVar4 != 0) {
    pcVar5 = (this->b->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(local_38,pcVar5,lVar4 * 2);
  }
  local_38 = local_38 + lVar4;
  if (lVar1 != (long)local_38 - (long)pQVar2 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }